

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O0

bool __thiscall Gluco::SimpSolver::eliminate(SimpSolver *this,bool turn_off_elim)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  byte *pbVar6;
  long lVar7;
  undefined1 auVar8 [16];
  byte local_4b;
  bool local_49;
  lbool local_2d;
  lbool local_2c;
  byte local_2b;
  lbool local_2a;
  lbool local_29;
  Var local_28;
  bool was_frozen;
  int iStack_24;
  Var elim;
  int cnt;
  int toPerform;
  bool turn_off_elim_local;
  SimpSolver *this_local;
  
  cnt._3_1_ = turn_off_elim;
  _toPerform = this;
  bVar1 = Solver::simplify(&this->super_Solver);
  if (bVar1) {
    if ((this->use_simplification & 1U) == 0) {
      this_local._7_1_ = true;
    }
    else {
      iVar3 = vec<unsigned_int>::size(&(this->super_Solver).clauses);
      elim = (Var)(iVar3 < 0x493e01);
      if (elim == 0) {
        printf("c Too many clauses... No preprocessing\n");
      }
      while( true ) {
        bVar1 = false;
        if ((elim != 0) && (bVar1 = true, this->n_touched < 1)) {
          iVar3 = this->bwdsub_assigns;
          iVar4 = vec<Gluco::Lit>::size(&(this->super_Solver).trail);
          bVar1 = true;
          if (iVar4 <= iVar3) {
            iVar3 = Heap<Gluco::SimpSolver::ElimLt>::size(&this->elim_heap);
            bVar1 = 0 < iVar3;
          }
        }
        if (!bVar1) break;
        gatherTouchedClauses(this);
        iVar3 = Queue<unsigned_int>::size(&this->subsumption_queue);
        if (((0 < iVar3) ||
            (iVar3 = this->bwdsub_assigns,
            iVar4 = vec<Gluco::Lit>::size(&(this->super_Solver).trail), iVar3 < iVar4)) &&
           (bVar1 = backwardSubsumptionCheck(this,true), !bVar1)) {
          (this->super_Solver).ok = false;
          break;
        }
        if (((this->super_Solver).asynch_interrupt & 1U) != 0) {
          iVar3 = this->bwdsub_assigns;
          iVar4 = vec<Gluco::Lit>::size(&(this->super_Solver).trail);
          if (iVar3 != iVar4) {
            __assert_fail("bwdsub_assigns == trail.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                          ,0x27d,"bool Gluco::SimpSolver::eliminate(bool)");
          }
          iVar3 = Queue<unsigned_int>::size(&this->subsumption_queue);
          if (iVar3 != 0) {
            __assert_fail("subsumption_queue.size() == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                          ,0x27e,"bool Gluco::SimpSolver::eliminate(bool)");
          }
          if (this->n_touched != 0) {
            __assert_fail("n_touched == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                          ,0x27f,"bool Gluco::SimpSolver::eliminate(bool)");
          }
          Heap<Gluco::SimpSolver::ElimLt>::clear(&this->elim_heap,false);
          break;
        }
        iStack_24 = 0;
        while ((bVar1 = Heap<Gluco::SimpSolver::ElimLt>::empty(&this->elim_heap),
               ((bVar1 ^ 0xffU) & 1) != 0 &&
               (local_28 = Heap<Gluco::SimpSolver::ElimLt>::removeMin(&this->elim_heap),
               ((this->super_Solver).asynch_interrupt & 1U) == 0))) {
          bVar1 = isEliminated(this,local_28);
          local_49 = true;
          if (!bVar1) {
            local_29 = Solver::value(&this->super_Solver,local_28);
            lbool::lbool(&local_2a,'\x02');
            local_49 = lbool::operator!=(&local_29,local_2a);
          }
          if (local_49 == false) {
            if ((1 < (this->super_Solver).verbosity) && (iStack_24 % 100 == 0)) {
              Heap<Gluco::SimpSolver::ElimLt>::size(&this->elim_heap);
              printf("elimination left: %10d\r");
            }
            if ((this->use_asymm & 1U) != 0) {
              pcVar5 = vec<char>::operator[](&this->frozen,local_28);
              local_2b = *pcVar5 != '\0';
              pcVar5 = vec<char>::operator[](&this->frozen,local_28);
              *pcVar5 = '\x01';
              bVar1 = asymmVar(this,local_28);
              if (!bVar1) {
                (this->super_Solver).ok = false;
                goto LAB_00731e43;
              }
              bVar2 = local_2b & 1;
              pbVar6 = (byte *)vec<char>::operator[](&this->frozen,local_28);
              *pbVar6 = bVar2;
            }
            local_4b = 0;
            if ((this->use_elim & 1U) != 0) {
              local_2c = Solver::value(&this->super_Solver,local_28);
              lbool::lbool(&local_2d,'\x02');
              bVar1 = lbool::operator==(&local_2c,local_2d);
              local_4b = 0;
              if (bVar1) {
                pcVar5 = vec<char>::operator[](&this->frozen,local_28);
                local_4b = 0;
                if (*pcVar5 == '\0') {
                  bVar1 = eliminateVar(this,local_28);
                  local_4b = bVar1 ^ 0xff;
                }
              }
            }
            if ((local_4b & 1) != 0) {
              (this->super_Solver).ok = false;
              goto LAB_00731e43;
            }
            Solver::checkGarbage(&this->super_Solver,this->simp_garbage_frac);
          }
          iStack_24 = iStack_24 + 1;
        }
        iVar3 = Queue<unsigned_int>::size(&this->subsumption_queue);
        if (iVar3 != 0) {
          __assert_fail("subsumption_queue.size() == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                        ,0x29e,"bool Gluco::SimpSolver::eliminate(bool)");
        }
      }
LAB_00731e43:
      if ((cnt._3_1_ & 1) == 0) {
        cleanUpClauses(this);
        Solver::checkGarbage(&this->super_Solver);
      }
      else {
        vec<char>::clear(&this->touched,true);
        OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::clear
                  (&this->occurs,true);
        vec<int>::clear(&this->n_occ,true);
        Heap<Gluco::SimpSolver::ElimLt>::clear(&this->elim_heap,true);
        Queue<unsigned_int>::clear(&this->subsumption_queue,true);
        this->use_simplification = false;
        (this->super_Solver).remove_satisfied = true;
        (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.field_0x14 = 0;
        Solver::rebuildOrderHeap(&this->super_Solver);
        (*(this->super_Solver)._vptr_Solver[3])();
      }
      if ((0 < (this->super_Solver).verbosity) &&
         (iVar3 = vec<unsigned_int>::size(&this->elimclauses), 0 < iVar3)) {
        iVar3 = vec<unsigned_int>::size(&this->elimclauses);
        lVar7 = (long)iVar3 << 2;
        auVar8._8_4_ = (int)((ulong)lVar7 >> 0x20);
        auVar8._0_8_ = lVar7;
        auVar8._12_4_ = 0x45300000;
        printf("c |  Eliminated clauses:     %10.2f Mb                                                                |\n"
               ,((auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / 1048576.0);
      }
      this_local._7_1_ = (bool)((this->super_Solver).ok & 1);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SimpSolver::eliminate(bool turn_off_elim)
{
    //abctime clk = Abc_Clock();
    if (!simplify())
        return false;
    else if (!use_simplification)
        return true;

    // Main simplification loop:
    //

    int toPerform = clauses.size()<=4800000;
    
    if(!toPerform) {
      printf("c Too many clauses... No preprocessing\n");
    }

    while (toPerform && (n_touched > 0 || bwdsub_assigns < trail.size() || elim_heap.size() > 0)){

        gatherTouchedClauses();
        // printf("  ## (time = %6.2f s) BWD-SUB: queue = %d, trail = %d\n", cpuTime(), subsumption_queue.size(), trail.size() - bwdsub_assigns);
        if ((subsumption_queue.size() > 0 || bwdsub_assigns < trail.size()) && 
            !backwardSubsumptionCheck(true)){
            ok = false; goto cleanup; }

        // Empty elim_heap and return immediately on user-interrupt:
        if (asynch_interrupt){
            assert(bwdsub_assigns == trail.size());
            assert(subsumption_queue.size() == 0);
            assert(n_touched == 0);
            elim_heap.clear();
            goto cleanup; }

        // printf("  ## (time = %6.2f s) ELIM: vars = %d\n", cpuTime(), elim_heap.size());
        for (int cnt = 0; !elim_heap.empty(); cnt++){
            Var elim = elim_heap.removeMin();
            
            if (asynch_interrupt) break;

            if (isEliminated(elim) || value(elim) != l_Undef) continue;

            if (verbosity >= 2 && cnt % 100 == 0)
                printf("elimination left: %10d\r", elim_heap.size());

            if (use_asymm){
                // Temporarily freeze variable. Otherwise, it would immediately end up on the queue again:
                bool was_frozen = frozen[elim] != 0;
                frozen[elim] = true;
                if (!asymmVar(elim)){
                    ok = false; goto cleanup; }
                frozen[elim] = was_frozen; }

            // At this point, the variable may have been set by assymetric branching, so check it
            // again. Also, don't eliminate frozen variables:
            if (use_elim && value(elim) == l_Undef && !frozen[elim] && !eliminateVar(elim)){
                ok = false; goto cleanup; }

            checkGarbage(simp_garbage_frac);
        }

        assert(subsumption_queue.size() == 0);
    }
 cleanup:

    // If no more simplification is needed, free all simplification-related data structures:
    if (turn_off_elim){
        touched  .clear(true);
        occurs   .clear(true);
        n_occ    .clear(true);
        elim_heap.clear(true);
        subsumption_queue.clear(true);

        use_simplification    = false;
        remove_satisfied      = true;
        ca.extra_clause_field = false;

        // Force full cleanup (this is safe and desirable since it only happens once):
        rebuildOrderHeap();
        garbageCollect();
    }else{
        // Cheaper cleanup:
        cleanUpClauses(); // TODO: can we make 'cleanUpClauses()' not be linear in the problem size somehow?
        checkGarbage();
    }

    if (verbosity >= 1 && elimclauses.size() > 0)
        printf("c |  Eliminated clauses:     %10.2f Mb                                                                |\n", 
               double(elimclauses.size() * sizeof(uint32_t)) / (1024*1024));
    return ok;
}